

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase347::run(TestCase347 *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  bool local_cf9;
  DebugExpression<bool_&> DStack_cf8;
  bool _kj_shouldLog_7;
  DebugExpression<bool_&> _kjCondition_7;
  int local_ce8;
  DebugExpression<int> DStack_ce4;
  bool _kj_shouldLog_6;
  undefined1 local_ce0 [8];
  DebugComparison<int,_int_&> _kjCondition_6;
  string local_cb0;
  string local_c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10;
  bool local_bea;
  allocator<char> local_be9;
  undefined1 local_be8 [6];
  bool _kj_shouldLog_5;
  string local_bc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  DebugExpression<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b28;
  undefined1 local_b08 [8];
  DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  _kjCondition_5;
  undefined1 local_aa0 [8];
  MockExceptionCallback mockCallback_5;
  string text_5;
  int local_a40;
  bool recovered;
  int result;
  string local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  bool local_972;
  allocator<char> local_971;
  undefined1 local_970 [6];
  bool _kj_shouldLog_4;
  string local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  DebugExpression<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8b0;
  undefined1 local_890 [8];
  DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  _kjCondition_4;
  undefined1 local_838 [8];
  MockExceptionCallback mockCallback_4;
  string text_4;
  string local_7d8;
  string local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  bool local_712;
  allocator<char> local_711;
  undefined1 local_710 [6];
  bool _kj_shouldLog_3;
  string local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  DebugExpression<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_650;
  undefined1 local_630 [8];
  DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  _kjCondition_3;
  undefined1 local_5d8 [8];
  MockExceptionCallback mockCallback_3;
  string text_3;
  string local_578;
  string local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  bool local_4b2;
  allocator<char> local_4b1;
  undefined1 local_4b0 [6];
  bool _kj_shouldLog_2;
  string local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  DebugExpression<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  undefined1 local_3d0 [8];
  DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  _kjCondition_2;
  undefined1 local_378 [8];
  MockExceptionCallback mockCallback_2;
  string text_2;
  string local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  bool local_252;
  allocator<char> local_251;
  undefined1 local_250 [6];
  bool _kj_shouldLog_1;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  DebugExpression<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  undefined1 local_170 [8];
  DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  _kjCondition_1;
  undefined1 local_118 [8];
  MockExceptionCallback mockCallback_1;
  string text_1;
  DebugExpression<const_char_(&)[1]> DStack_b8;
  bool _kj_shouldLog;
  undefined1 local_b0 [8];
  DebugComparison<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  _kjCondition;
  undefined1 local_78 [8];
  MockExceptionCallback mockCallback;
  string text;
  char *str;
  int i;
  int line;
  TestCase347 *this_local;
  
  str._0_4_ = 0x7b;
  _i = this;
  ::std::__cxx11::string::string((string *)&mockCallback.outputPipe);
  MockExceptionCallback::MockExceptionCallback((MockExceptionCallback *)local_78);
  run::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&_kjCondition.field_0x23);
  pbVar2 = mv<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &mockCallback.super_ExceptionCallback.next);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &mockCallback.outputPipe,pbVar2);
  MockExceptionCallback::~MockExceptionCallback((MockExceptionCallback *)local_78);
  DStack_b8 = DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,(char (*) [1])0x32aeee);
  DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_b0,(DebugExpression<char_const(&)[1]> *)&stack0xffffffffffffff48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &mockCallback.outputPipe);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
  if (!bVar1) {
    text_1.field_2._M_local_buf[0xf] = Debug::shouldLog(ERROR);
    while (text_1.field_2._M_local_buf[0xf] != '\0') {
      Debug::
      log<char_const(&)[32],kj::_::DebugComparison<char_const(&)[1],std::__cxx11::string&>&,char_const(&)[1],std::__cxx11::string&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0x164,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (text)\", _kjCondition, \"\", text",
                 (char (*) [32])"failed: expected (\"\") == (text)",
                 (DebugComparison<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)local_b0,(char (*) [1])0x32aeee,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mockCallback.outputPipe);
      text_1.field_2._M_local_buf[0xf] = '\0';
    }
  }
  ::std::__cxx11::string::~string((string *)&mockCallback.outputPipe);
  ::std::__cxx11::string::string((string *)&mockCallback_1.outputPipe);
  MockExceptionCallback::MockExceptionCallback((MockExceptionCallback *)local_118);
  _kjCondition_1._56_8_ = &str;
  run::anon_class_24_3_0fcacba3::operator()((anon_class_24_3_0fcacba3 *)&_kjCondition_1.result);
  pbVar2 = mv<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &mockCallback_1.super_ExceptionCallback.next);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &mockCallback_1.outputPipe,pbVar2);
  MockExceptionCallback::~MockExceptionCallback((MockExceptionCallback *)local_118);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_250,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_251);
  fileLine(&local_230,(string *)local_250,str._4_4_);
  ::std::operator+(&local_210,"fatal exception: ",&local_230);
  ::std::operator+(&local_1f0,&local_210,": failed: mockSyscall(-1, EBADF): ");
  pcVar3 = strerror(9);
  ::std::operator+(&local_1d0,&local_1f0,pcVar3);
  ::std::operator+(&local_1b0,&local_1d0,"; i = 123; bar; str = foo\n");
  DebugExpressionStart::operator<<(&local_190,(DebugExpressionStart *)&_::MAGIC_ASSERT,&local_1b0);
  DebugExpression<std::__cxx11::string>::operator==
            ((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_170,(DebugExpression<std::__cxx11::string> *)&local_190,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &mockCallback_1.outputPipe);
  DebugExpression<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~DebugExpression(&local_190);
  ::std::__cxx11::string::~string((string *)&local_1b0);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  ::std::__cxx11::string::~string((string *)&local_210);
  ::std::__cxx11::string::~string((string *)&local_230);
  ::std::__cxx11::string::~string((string *)local_250);
  ::std::allocator<char>::~allocator(&local_251);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_170);
  if (!bVar1) {
    local_252 = Debug::shouldLog(ERROR);
    while (local_252 != false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_318,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,(allocator<char> *)(text_2.field_2._M_local_buf + 0xf));
      fileLine(&local_2f8,&local_318,str._4_4_);
      ::std::operator+(&local_2d8,"fatal exception: ",&local_2f8);
      ::std::operator+(&local_2b8,&local_2d8,": failed: mockSyscall(-1, EBADF): ");
      pcVar3 = strerror(9);
      ::std::operator+(&local_298,&local_2b8,pcVar3);
      ::std::operator+(&local_278,&local_298,"; i = 123; bar; str = foo\n");
      Debug::
      log<char_const(&)[256],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0x16c,ERROR,
                 "\"failed: expected \" \"(( \\\"fatal exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": failed: mockSyscall(-1, EBADF): \\\" + strerror(9) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": failed: mockSyscall(-1, EBADF): \" + strerror(9) + \"; i = 123; bar; str = foo\\n\" ), text"
                 ,(char (*) [256])
                  "failed: expected (( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": failed: mockSyscall(-1, EBADF): \" + strerror(9) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
                 ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                   *)local_170,&local_278,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mockCallback_1.outputPipe);
      ::std::__cxx11::string::~string((string *)&local_278);
      ::std::__cxx11::string::~string((string *)&local_298);
      ::std::__cxx11::string::~string((string *)&local_2b8);
      ::std::__cxx11::string::~string((string *)&local_2d8);
      ::std::__cxx11::string::~string((string *)&local_2f8);
      ::std::__cxx11::string::~string((string *)&local_318);
      ::std::allocator<char>::~allocator((allocator<char> *)(text_2.field_2._M_local_buf + 0xf));
      local_252 = false;
    }
  }
  DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~DebugComparison((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)local_170);
  ::std::__cxx11::string::~string((string *)&mockCallback_1.outputPipe);
  ::std::__cxx11::string::string((string *)&mockCallback_2.outputPipe);
  MockExceptionCallback::MockExceptionCallback((MockExceptionCallback *)local_378);
  _kjCondition_2._56_8_ = &str;
  run::anon_class_24_3_0fcacba3::operator()((anon_class_24_3_0fcacba3 *)&_kjCondition_2.result);
  pbVar2 = mv<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &mockCallback_2.super_ExceptionCallback.next);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &mockCallback_2.outputPipe,pbVar2);
  MockExceptionCallback::~MockExceptionCallback((MockExceptionCallback *)local_378);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4b0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_4b1);
  fileLine(&local_490,(string *)local_4b0,str._4_4_);
  ::std::operator+(&local_470,"fatal exception: ",&local_490);
  ::std::operator+(&local_450,&local_470,": disconnected: mockSyscall(-1, ECONNRESET): ");
  pcVar3 = strerror(0x68);
  ::std::operator+(&local_430,&local_450,pcVar3);
  ::std::operator+(&local_410,&local_430,"; i = 123; bar; str = foo\n");
  DebugExpressionStart::operator<<(&local_3f0,(DebugExpressionStart *)&_::MAGIC_ASSERT,&local_410);
  DebugExpression<std::__cxx11::string>::operator==
            ((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_3d0,(DebugExpression<std::__cxx11::string> *)&local_3f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &mockCallback_2.outputPipe);
  DebugExpression<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~DebugExpression(&local_3f0);
  ::std::__cxx11::string::~string((string *)&local_410);
  ::std::__cxx11::string::~string((string *)&local_430);
  ::std::__cxx11::string::~string((string *)&local_450);
  ::std::__cxx11::string::~string((string *)&local_470);
  ::std::__cxx11::string::~string((string *)&local_490);
  ::std::__cxx11::string::~string((string *)local_4b0);
  ::std::allocator<char>::~allocator(&local_4b1);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_3d0);
  if (!bVar1) {
    local_4b2 = Debug::shouldLog(ERROR);
    while (local_4b2 != false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_578,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,(allocator<char> *)(text_3.field_2._M_local_buf + 0xf));
      fileLine(&local_558,&local_578,str._4_4_);
      ::std::operator+(&local_538,"fatal exception: ",&local_558);
      ::std::operator+(&local_518,&local_538,": disconnected: mockSyscall(-1, ECONNRESET): ");
      pcVar3 = strerror(0x68);
      ::std::operator+(&local_4f8,&local_518,pcVar3);
      ::std::operator+(&local_4d8,&local_4f8,"; i = 123; bar; str = foo\n");
      Debug::
      log<char_const(&)[269],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0x174,ERROR,
                 "\"failed: expected \" \"(( \\\"fatal exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": disconnected: mockSyscall(-1, ECONNRESET): \\\" + strerror(104) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": disconnected: mockSyscall(-1, ECONNRESET): \" + strerror(104) + \"; i = 123; bar; str = foo\\n\" ), text"
                 ,(char (*) [269])
                  "failed: expected (( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": disconnected: mockSyscall(-1, ECONNRESET): \" + strerror(104) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
                 ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                   *)local_3d0,&local_4d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mockCallback_2.outputPipe);
      ::std::__cxx11::string::~string((string *)&local_4d8);
      ::std::__cxx11::string::~string((string *)&local_4f8);
      ::std::__cxx11::string::~string((string *)&local_518);
      ::std::__cxx11::string::~string((string *)&local_538);
      ::std::__cxx11::string::~string((string *)&local_558);
      ::std::__cxx11::string::~string((string *)&local_578);
      ::std::allocator<char>::~allocator((allocator<char> *)(text_3.field_2._M_local_buf + 0xf));
      local_4b2 = false;
    }
  }
  DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~DebugComparison((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)local_3d0);
  ::std::__cxx11::string::~string((string *)&mockCallback_2.outputPipe);
  ::std::__cxx11::string::string((string *)&mockCallback_3.outputPipe);
  MockExceptionCallback::MockExceptionCallback((MockExceptionCallback *)local_5d8);
  _kjCondition_3._56_8_ = &str;
  run::anon_class_24_3_0fcacba3::operator()((anon_class_24_3_0fcacba3 *)&_kjCondition_3.result);
  pbVar2 = mv<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &mockCallback_3.super_ExceptionCallback.next);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &mockCallback_3.outputPipe,pbVar2);
  MockExceptionCallback::~MockExceptionCallback((MockExceptionCallback *)local_5d8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_710,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_711);
  fileLine(&local_6f0,(string *)local_710,str._4_4_);
  ::std::operator+(&local_6d0,"fatal exception: ",&local_6f0);
  ::std::operator+(&local_6b0,&local_6d0,": overloaded: mockSyscall(-1, ENOMEM): ");
  pcVar3 = strerror(0xc);
  ::std::operator+(&local_690,&local_6b0,pcVar3);
  ::std::operator+(&local_670,&local_690,"; i = 123; bar; str = foo\n");
  DebugExpressionStart::operator<<(&local_650,(DebugExpressionStart *)&_::MAGIC_ASSERT,&local_670);
  DebugExpression<std::__cxx11::string>::operator==
            ((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_630,(DebugExpression<std::__cxx11::string> *)&local_650,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &mockCallback_3.outputPipe);
  DebugExpression<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~DebugExpression(&local_650);
  ::std::__cxx11::string::~string((string *)&local_670);
  ::std::__cxx11::string::~string((string *)&local_690);
  ::std::__cxx11::string::~string((string *)&local_6b0);
  ::std::__cxx11::string::~string((string *)&local_6d0);
  ::std::__cxx11::string::~string((string *)&local_6f0);
  ::std::__cxx11::string::~string((string *)local_710);
  ::std::allocator<char>::~allocator(&local_711);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_630);
  if (!bVar1) {
    local_712 = Debug::shouldLog(ERROR);
    while (local_712 != false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,(allocator<char> *)(text_4.field_2._M_local_buf + 0xf));
      fileLine(&local_7b8,&local_7d8,str._4_4_);
      ::std::operator+(&local_798,"fatal exception: ",&local_7b8);
      ::std::operator+(&local_778,&local_798,": overloaded: mockSyscall(-1, ENOMEM): ");
      pcVar3 = strerror(0xc);
      ::std::operator+(&local_758,&local_778,pcVar3);
      ::std::operator+(&local_738,&local_758,"; i = 123; bar; str = foo\n");
      Debug::
      log<char_const(&)[262],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0x17c,ERROR,
                 "\"failed: expected \" \"(( \\\"fatal exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": overloaded: mockSyscall(-1, ENOMEM): \\\" + strerror(12) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": overloaded: mockSyscall(-1, ENOMEM): \" + strerror(12) + \"; i = 123; bar; str = foo\\n\" ), text"
                 ,(char (*) [262])
                  "failed: expected (( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": overloaded: mockSyscall(-1, ENOMEM): \" + strerror(12) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
                 ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                   *)local_630,&local_738,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mockCallback_3.outputPipe);
      ::std::__cxx11::string::~string((string *)&local_738);
      ::std::__cxx11::string::~string((string *)&local_758);
      ::std::__cxx11::string::~string((string *)&local_778);
      ::std::__cxx11::string::~string((string *)&local_798);
      ::std::__cxx11::string::~string((string *)&local_7b8);
      ::std::__cxx11::string::~string((string *)&local_7d8);
      ::std::allocator<char>::~allocator((allocator<char> *)(text_4.field_2._M_local_buf + 0xf));
      local_712 = false;
    }
  }
  DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~DebugComparison((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)local_630);
  ::std::__cxx11::string::~string((string *)&mockCallback_3.outputPipe);
  ::std::__cxx11::string::string((string *)&mockCallback_4.outputPipe);
  MockExceptionCallback::MockExceptionCallback((MockExceptionCallback *)local_838);
  _kjCondition_4._56_8_ = &str;
  run::anon_class_24_3_0fcacba3::operator()((anon_class_24_3_0fcacba3 *)&_kjCondition_4.result);
  pbVar2 = mv<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &mockCallback_4.super_ExceptionCallback.next);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &mockCallback_4.outputPipe,pbVar2);
  MockExceptionCallback::~MockExceptionCallback((MockExceptionCallback *)local_838);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_970,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_971);
  fileLine(&local_950,(string *)local_970,str._4_4_);
  ::std::operator+(&local_930,"fatal exception: ",&local_950);
  ::std::operator+(&local_910,&local_930,": unimplemented: mockSyscall(-1, ENOSYS): ");
  pcVar3 = strerror(0x26);
  ::std::operator+(&local_8f0,&local_910,pcVar3);
  ::std::operator+(&local_8d0,&local_8f0,"; i = 123; bar; str = foo\n");
  DebugExpressionStart::operator<<(&local_8b0,(DebugExpressionStart *)&_::MAGIC_ASSERT,&local_8d0);
  DebugExpression<std::__cxx11::string>::operator==
            ((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_890,(DebugExpression<std::__cxx11::string> *)&local_8b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &mockCallback_4.outputPipe);
  DebugExpression<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~DebugExpression(&local_8b0);
  ::std::__cxx11::string::~string((string *)&local_8d0);
  ::std::__cxx11::string::~string((string *)&local_8f0);
  ::std::__cxx11::string::~string((string *)&local_910);
  ::std::__cxx11::string::~string((string *)&local_930);
  ::std::__cxx11::string::~string((string *)&local_950);
  ::std::__cxx11::string::~string((string *)local_970);
  ::std::allocator<char>::~allocator(&local_971);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_890);
  if (!bVar1) {
    local_972 = Debug::shouldLog(ERROR);
    while (local_972 != false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,(allocator<char> *)&recovered);
      fileLine(&local_a18,(string *)&result,str._4_4_);
      ::std::operator+(&local_9f8,"fatal exception: ",&local_a18);
      ::std::operator+(&local_9d8,&local_9f8,": unimplemented: mockSyscall(-1, ENOSYS): ");
      pcVar3 = strerror(0x26);
      ::std::operator+(&local_9b8,&local_9d8,pcVar3);
      ::std::operator+(&local_998,&local_9b8,"; i = 123; bar; str = foo\n");
      Debug::
      log<char_const(&)[265],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0x184,ERROR,
                 "\"failed: expected \" \"(( \\\"fatal exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": unimplemented: mockSyscall(-1, ENOSYS): \\\" + strerror(38) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": unimplemented: mockSyscall(-1, ENOSYS): \" + strerror(38) + \"; i = 123; bar; str = foo\\n\" ), text"
                 ,(char (*) [265])
                  "failed: expected (( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": unimplemented: mockSyscall(-1, ENOSYS): \" + strerror(38) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
                 ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                   *)local_890,&local_998,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mockCallback_4.outputPipe);
      ::std::__cxx11::string::~string((string *)&local_998);
      ::std::__cxx11::string::~string((string *)&local_9b8);
      ::std::__cxx11::string::~string((string *)&local_9d8);
      ::std::__cxx11::string::~string((string *)&local_9f8);
      ::std::__cxx11::string::~string((string *)&local_a18);
      ::std::__cxx11::string::~string((string *)&result);
      ::std::allocator<char>::~allocator((allocator<char> *)&recovered);
      local_972 = false;
    }
  }
  DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~DebugComparison((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)local_890);
  ::std::__cxx11::string::~string((string *)&mockCallback_4.outputPipe);
  local_a40 = 0;
  text_5.field_2._M_local_buf[0xf] = '\0';
  ::std::__cxx11::string::string((string *)&mockCallback_5.outputPipe);
  MockExceptionCallback::MockExceptionCallback((MockExceptionCallback *)local_aa0);
  _kjCondition_5._56_8_ = &local_a40;
  run::anon_class_40_5_1447d044::operator()((anon_class_40_5_1447d044 *)&_kjCondition_5.result);
  pbVar2 = mv<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &mockCallback_5.super_ExceptionCallback.next);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &mockCallback_5.outputPipe,pbVar2);
  MockExceptionCallback::~MockExceptionCallback((MockExceptionCallback *)local_aa0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_be8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_be9);
  fileLine(&local_bc8,(string *)local_be8,str._4_4_);
  ::std::operator+(&local_ba8,"recoverable exception: ",&local_bc8);
  ::std::operator+(&local_b88,&local_ba8,": failed: mockSyscall(-2, EBADF): ");
  pcVar3 = strerror(9);
  ::std::operator+(&local_b68,&local_b88,pcVar3);
  ::std::operator+(&local_b48,&local_b68,"; i = 123; bar; str = foo\n");
  DebugExpressionStart::operator<<(&local_b28,(DebugExpressionStart *)&_::MAGIC_ASSERT,&local_b48);
  DebugExpression<std::__cxx11::string>::operator==
            ((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_b08,(DebugExpression<std::__cxx11::string> *)&local_b28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &mockCallback_5.outputPipe);
  DebugExpression<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~DebugExpression(&local_b28);
  ::std::__cxx11::string::~string((string *)&local_b48);
  ::std::__cxx11::string::~string((string *)&local_b68);
  ::std::__cxx11::string::~string((string *)&local_b88);
  ::std::__cxx11::string::~string((string *)&local_ba8);
  ::std::__cxx11::string::~string((string *)&local_bc8);
  ::std::__cxx11::string::~string((string *)local_be8);
  ::std::allocator<char>::~allocator(&local_be9);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_b08);
  if (!bVar1) {
    local_bea = Debug::shouldLog(ERROR);
    while (local_bea != false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cb0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,(allocator<char> *)&_kjCondition_6.field_0x27);
      fileLine(&local_c90,&local_cb0,str._4_4_);
      ::std::operator+(&local_c70,"recoverable exception: ",&local_c90);
      ::std::operator+(&local_c50,&local_c70,": failed: mockSyscall(-2, EBADF): ");
      pcVar3 = strerror(9);
      ::std::operator+(&local_c30,&local_c50,pcVar3);
      ::std::operator+(&local_c10,&local_c30,"; i = 123; bar; str = foo\n");
      Debug::
      log<char_const(&)[262],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0x18e,ERROR,
                 "\"failed: expected \" \"(( \\\"recoverable exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": failed: mockSyscall(-2, EBADF): \\\" + strerror(9) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"recoverable exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": failed: mockSyscall(-2, EBADF): \" + strerror(9) + \"; i = 123; bar; str = foo\\n\" ), text"
                 ,(char (*) [262])
                  "failed: expected (( \"recoverable exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": failed: mockSyscall(-2, EBADF): \" + strerror(9) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
                 ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                   *)local_b08,&local_c10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mockCallback_5.outputPipe);
      ::std::__cxx11::string::~string((string *)&local_c10);
      ::std::__cxx11::string::~string((string *)&local_c30);
      ::std::__cxx11::string::~string((string *)&local_c50);
      ::std::__cxx11::string::~string((string *)&local_c70);
      ::std::__cxx11::string::~string((string *)&local_c90);
      ::std::__cxx11::string::~string((string *)&local_cb0);
      ::std::allocator<char>::~allocator((allocator<char> *)&_kjCondition_6.field_0x27);
      local_bea = false;
    }
  }
  DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~DebugComparison((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)local_b08);
  ::std::__cxx11::string::~string((string *)&mockCallback_5.outputPipe);
  local_ce8 = -2;
  DStack_ce4 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_ce8)
  ;
  DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_ce0,&stack0xfffffffffffff31c,&local_a40);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_ce0);
  if (!bVar1) {
    _kjCondition_7.value._7_1_ = Debug::shouldLog(ERROR);
    while ((bool)_kjCondition_7.value._7_1_ != false) {
      _kjCondition_7.value._0_4_ = 0xfffffffe;
      Debug::log<char_const(&)[34],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,399,ERROR,"\"failed: expected \" \"(-2) == (result)\", _kjCondition, -2, result",
                 (char (*) [34])"failed: expected (-2) == (result)",
                 (DebugComparison<int,_int_&> *)local_ce0,(int *)&_kjCondition_7,&local_a40);
      _kjCondition_7.value._7_1_ = false;
    }
  }
  DStack_cf8 = DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                          (bool *)(text_5.field_2._M_local_buf + 0xf));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&stack0xfffffffffffff308);
  if (!bVar1) {
    local_cf9 = Debug::shouldLog(ERROR);
    while (local_cf9 != false) {
      Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
                 ,400,ERROR,"\"failed: expected \" \"recovered\", _kjCondition",
                 (char (*) [27])"failed: expected recovered",&stack0xfffffffffffff308);
      local_cf9 = false;
    }
  }
  return;
}

Assistant:

TEST(Debug, Syscall) {
  int line;

  int i = 123;
  const char* str = "foo";

  EXPECT_LOG_EQ([&](){
    KJ_SYSCALL(mockSyscall(0));
    KJ_SYSCALL(mockSyscall(1));
  }, "");

  EXPECT_LOG_EQ([&](){
    EXPECT_FATAL(KJ_SYSCALL(mockSyscall(-1, EBADF), i, "bar", str)); line = __LINE__;
  }, (
    "fatal exception: " + fileLine(__FILE__, line) +
        ": failed: mockSyscall(-1, EBADF): " + strerror(EBADF) +
        "; i = 123; bar; str = foo\n"
  ));

  EXPECT_LOG_EQ([&](){
    EXPECT_FATAL(KJ_SYSCALL(mockSyscall(-1, ECONNRESET), i, "bar", str)); line = __LINE__;
  }, (
    "fatal exception: " + fileLine(__FILE__, line) +
        ": disconnected: mockSyscall(-1, ECONNRESET): " + strerror(ECONNRESET) +
        "; i = 123; bar; str = foo\n"
  ));

  EXPECT_LOG_EQ([&](){
    EXPECT_FATAL(KJ_SYSCALL(mockSyscall(-1, ENOMEM), i, "bar", str)); line = __LINE__;
  }, (
    "fatal exception: " + fileLine(__FILE__, line) +
        ": overloaded: mockSyscall(-1, ENOMEM): " + strerror(ENOMEM) +
        "; i = 123; bar; str = foo\n"
  ));

  EXPECT_LOG_EQ([&](){
    EXPECT_FATAL(KJ_SYSCALL(mockSyscall(-1, ENOSYS), i, "bar", str)); line = __LINE__;
  }, (
    "fatal exception: " + fileLine(__FILE__, line) +
        ": unimplemented: mockSyscall(-1, ENOSYS): " + strerror(ENOSYS) +
        "; i = 123; bar; str = foo\n"
  ));

  int result = 0;
  bool recovered = false;
  EXPECT_LOG_EQ([&](){
    KJ_SYSCALL(result = mockSyscall(-2, EBADF), i, "bar", str) { recovered = true; break; } line = __LINE__;
  }, (
    "recoverable exception: " + fileLine(__FILE__, line) +
        ": failed: mockSyscall(-2, EBADF): " + strerror(EBADF) +
        "; i = 123; bar; str = foo\n"
  ));
  EXPECT_EQ(-2, result);
  EXPECT_TRUE(recovered);
}